

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeDebugSource(Builder *this,Id fileName)

{
  bool bVar1;
  Id resultId_00;
  Id typeId;
  Instruction *this_00;
  pointer ppVar2;
  mapped_type *pmVar3;
  value_type local_60;
  _Self local_58;
  _Self local_50;
  iterator incItr;
  Id sourceId;
  Instruction *sourceInst;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_30;
  Id resultId;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  Id local_1c;
  Builder *pBStack_18;
  Id fileName_local;
  Builder *this_local;
  
  local_1c = fileName;
  pBStack_18 = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(&this->debugSourceId,&local_1c);
  _Stack_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(&this->debugSourceId);
  bVar1 = std::__detail::operator!=(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugSourceId,&local_1c);
    this_local._4_4_ = *pmVar3;
  }
  else {
    resultId_00 = getUniqueId(this);
    this_00 = (Instruction *)::operator_new(0x60);
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(this_00,resultId_00,typeId,OpExtInst);
    spv::Instruction::reserveOperands(this_00,3);
    spv::Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(this_00,0x23);
    spv::Instruction::addIdOperand(this_00,local_1c);
    if ((this->emitNonSemanticShaderDebugSource & 1U) != 0) {
      incItr._M_node._4_4_ = 0;
      if (local_1c == this->mainFileId) {
        incItr._M_node._4_4_ = getStringId(this,&this->sourceText);
      }
      else {
        local_50._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             ::find(&this->includeFiles,&local_1c);
        local_58._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             ::end(&this->includeFiles);
        bVar1 = std::operator!=(&local_50,&local_58);
        if (bVar1) {
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                   ::operator->(&local_50);
          incItr._M_node._4_4_ = getStringId(this,ppVar2->second);
        }
      }
      if (incItr._M_node._4_4_ != 0) {
        spv::Instruction::addIdOperand(this_00,incItr._M_node._4_4_);
      }
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_60,
               this_00);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_60);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_60);
    Module::mapInstruction(&this->module,this_00);
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugSourceId,&local_1c);
    *pmVar3 = resultId_00;
    this_local._4_4_ = resultId_00;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::makeDebugSource(const Id fileName) {
    if (debugSourceId.find(fileName) != debugSourceId.end())
        return debugSourceId[fileName];
    spv::Id resultId = getUniqueId();
    Instruction* sourceInst = new Instruction(resultId, makeVoidType(), OpExtInst);
    sourceInst->reserveOperands(3);
    sourceInst->addIdOperand(nonSemanticShaderDebugInfo);
    sourceInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugSource);
    sourceInst->addIdOperand(fileName);
    if (emitNonSemanticShaderDebugSource) {
        spv::Id sourceId = 0;
        if (fileName == mainFileId) {
            sourceId = getStringId(sourceText);
        } else {
            auto incItr = includeFiles.find(fileName);
            if (incItr != includeFiles.end()) {
                sourceId = getStringId(*incItr->second);
            }
        }

        // We omit the optional source text item if not available in glslang
        if (sourceId != 0) {
            sourceInst->addIdOperand(sourceId);
        }
    }
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(sourceInst));
    module.mapInstruction(sourceInst);
    debugSourceId[fileName] = resultId;
    return resultId;
}